

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

BinaryExpr<const_trng::matrix<trng::GF2,_4UL>_&,_const_trng::matrix<trng::GF2,_4UL>_&> * __thiscall
Catch::ExprLhs<trng::matrix<trng::GF2,4ul>const&>::operator==
          (BinaryExpr<const_trng::matrix<trng::GF2,_4UL>_&,_const_trng::matrix<trng::GF2,_4UL>_&>
           *__return_storage_ptr__,ExprLhs<trng::matrix<trng::GF2,4ul>const&> *this,
          matrix<trng::GF2,_4UL> *rhs)

{
  matrix<trng::GF2,_4UL> *pmVar1;
  pointer pGVar2;
  pointer pGVar3;
  pointer pGVar4;
  bool bVar5;
  StringRef local_38;
  
  pmVar1 = *(matrix<trng::GF2,_4UL> **)this;
  pGVar3 = (pmVar1->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar2 = (pmVar1->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pGVar4 = (rhs->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)pGVar2 - (long)pGVar3 ==
      (long)(rhs->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pGVar4) {
    bVar5 = true;
    for (; pGVar3 != pGVar2; pGVar3 = pGVar3 + 1) {
      if (pGVar3->value != pGVar4->value) goto LAB_0027ed7b;
      pGVar4 = pGVar4 + 1;
    }
  }
  else {
LAB_0027ed7b:
    bVar5 = false;
  }
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar5;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00318de0;
  __return_storage_ptr__->m_lhs = pmVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }